

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackRPMGenerator::PackageComponentsAllInOne(cmCPackRPMGenerator *this,string *compInstDirName)

{
  cmCPackLog *pcVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  ulong uVar7;
  string local_5a8 [32];
  undefined1 local_588 [8];
  ostringstream cmCPackLog_msg_1;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0 [8];
  string component_path;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  allocator<char> local_349;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  allocator<char> local_302;
  allocator<char> local_301;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 local_2c0 [8];
  string outputFileName;
  string packageFileName;
  string localToplevel;
  undefined1 local_240 [8];
  ostringstream cmCPackLog_msg;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_75 [20];
  allocator<char> local_61;
  string local_60;
  string local_40 [8];
  string initialTopLevel;
  int retval;
  string *compInstDirName_local;
  cmCPackRPMGenerator *this_local;
  
  initialTopLevel.field_2._12_4_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->super_cmCPackGenerator).packageFileNames);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CPACK_TEMPORARY_DIRECTORY",&local_61);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,pcVar5,local_75);
  std::allocator<char>::~allocator(local_75);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE",&local_99);
  bVar3 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"CPACK_RPM_DEBUGINFO_PACKAGE",&local_c1);
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_c0,"ON");
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
  poVar6 = std::operator<<((ostream *)local_240,
                           "Packaging all groups in one package...(CPACK_COMPONENTS_ALL_[GROUPS_]IN_ONE_PACKAGE is set)"
                          );
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                  ,0x164,pcVar5);
  std::__cxx11::string::~string((string *)(localToplevel.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
  std::__cxx11::string::string((string *)(packageFileName.field_2._M_local_buf + 8),local_40);
  cmsys::SystemTools::GetParentDirectory
            ((string *)((long)&outputFileName.field_2 + 8),&(this->super_cmCPackGenerator).toplevel)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"CPACK_PACKAGE_FILE_NAME",&local_301);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_300);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,pcVar5,&local_302);
  iVar4 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
                 &local_2e0,(char *)CONCAT44(extraout_var,iVar4));
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_302);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::operator+(&local_328,"/",compInstDirName);
  std::__cxx11::string::operator+=
            ((string *)(packageFileName.field_2._M_local_buf + 8),(string *)&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"CPACK_TEMPORARY_DIRECTORY",&local_349);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_348,pcVar5);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  std::operator+(&local_370,"/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0);
  std::__cxx11::string::operator+=
            ((string *)(outputFileName.field_2._M_local_buf + 8),(string *)&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"CPACK_OUTPUT_FILE_NAME",&local_391);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_390,pcVar5);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",
             (allocator<char> *)(component_path.field_2._M_local_buf + 0xf));
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_3b8,pcVar5);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)(component_path.field_2._M_local_buf + 0xf));
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3e0,"/",&local_3e1);
    std::allocator<char>::~allocator(&local_3e1);
    std::__cxx11::string::operator+=(local_3e0,(string *)compInstDirName);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"CPACK_RPM_PACKAGE_COMPONENT_PART_PATH",&local_409);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_408,pcVar5);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator(&local_409);
    std::__cxx11::string::~string(local_3e0);
  }
  bVar3 = cmCPackGenerator::ReadListFile
                    (&this->super_cmCPackGenerator,"Internal/CPack/CPackRPM.cmake");
  if (bVar3) {
    AddGeneratedPackageNames(this);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_588);
    poVar6 = std::operator<<((ostream *)local_588,"Error while execution CPackRPM.cmake");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                    ,0x184,pcVar5);
    std::__cxx11::string::~string(local_5a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_588);
    initialTopLevel.field_2._12_4_ = 0;
  }
  uVar2 = initialTopLevel.field_2._12_4_;
  std::__cxx11::string::~string((string *)local_2c0);
  std::__cxx11::string::~string((string *)(outputFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(packageFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_40);
  return uVar2;
}

Assistant:

int cmCPackRPMGenerator::PackageComponentsAllInOne(
  const std::string& compInstDirName)
{
  int retval = 1;
  /* Reset package file name list it will be populated during the
   * component packaging run*/
  packageFileNames.clear();
  std::string initialTopLevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));

  if (this->IsOn("CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE")) {
    this->SetOption("CPACK_RPM_DEBUGINFO_PACKAGE", "ON");
  }

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Packaging all groups in one package..."
                "(CPACK_COMPONENTS_ALL_[GROUPS_]IN_ONE_PACKAGE is set)"
                  << std::endl);

  // The ALL GROUPS in ONE package case
  std::string localToplevel(initialTopLevel);
  std::string packageFileName(cmSystemTools::GetParentDirectory(toplevel));
  std::string outputFileName(
    std::string(this->GetOption("CPACK_PACKAGE_FILE_NAME")) +
    this->GetOutputExtension());
  // all GROUP in one vs all COMPONENT in one
  localToplevel += "/" + compInstDirName;

  /* replace the TEMP DIRECTORY with the component one */
  this->SetOption("CPACK_TEMPORARY_DIRECTORY", localToplevel.c_str());
  packageFileName += "/" + outputFileName;
  /* replace proposed CPACK_OUTPUT_FILE_NAME */
  this->SetOption("CPACK_OUTPUT_FILE_NAME", outputFileName.c_str());
  /* replace the TEMPORARY package file name */
  this->SetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME",
                  packageFileName.c_str());

  if (!compInstDirName.empty()) {
    // Tell CPackRPM.cmake the path where the component is.
    std::string component_path = "/";
    component_path += compInstDirName;
    this->SetOption("CPACK_RPM_PACKAGE_COMPONENT_PART_PATH",
                    component_path.c_str());
  }

  if (this->ReadListFile("Internal/CPack/CPackRPM.cmake")) {
    AddGeneratedPackageNames();
  } else {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error while execution CPackRPM.cmake" << std::endl);
    retval = 0;
  }

  return retval;
}